

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLNode * __thiscall tinyxml2::XMLUnknown::ShallowClone(XMLUnknown *this,XMLDocument *doc)

{
  int iVar1;
  undefined4 extraout_var;
  char *str;
  XMLNode *pXVar2;
  XMLDocument *pXVar3;
  undefined4 extraout_var_00;
  
  pXVar3 = (this->super_XMLNode)._document;
  iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    str = StrPair::GetStr(&(this->super_XMLNode)._value);
  }
  else {
    str = (char *)0x0;
  }
  if (doc != (XMLDocument *)0x0) {
    pXVar3 = doc;
  }
  iVar1 = (*(pXVar3->_commentPool).super_MemPool._vptr_MemPool[3])(&pXVar3->_commentPool);
  pXVar2 = (XMLNode *)CONCAT44(extraout_var_00,iVar1);
  pXVar2->_document = pXVar3;
  pXVar2->_parent = (XMLNode *)0x0;
  (pXVar2->_value)._flags = 0;
  (pXVar2->_value)._start = (char *)0x0;
  (pXVar2->_value)._end = (char *)0x0;
  pXVar2->_parseLineNum = 0;
  pXVar2->_userData = (void *)0x0;
  pXVar2->_memPool = (MemPool *)0x0;
  pXVar2->_firstChild = (XMLNode *)0x0;
  pXVar2->_lastChild = (XMLNode *)0x0;
  pXVar2->_prev = (XMLNode *)0x0;
  pXVar2->_next = (XMLNode *)0x0;
  pXVar2->_vptr_XMLNode = (_func_int **)&PTR_ToElement_001155c0;
  pXVar2->_memPool = &(pXVar3->_commentPool).super_MemPool;
  StrPair::SetStr(&pXVar2->_value,str,0);
  return pXVar2;
}

Assistant:

XMLNode* XMLUnknown::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLUnknown* text = doc->NewUnknown( Value() );	// fixme: this will always allocate memory. Intern?
    return text;
}